

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * GetContextValue(InstructionVMEvalContext *ctx,FunctionData *data)

{
  StackFrame *pSVar1;
  uint uVar2;
  StackFrame **ppSVar3;
  VmConstant *pVVar4;
  VmType type_00;
  uint offset;
  VmType type;
  TypeBase *contextType;
  StackFrame *frame;
  FunctionData *data_local;
  InstructionVMEvalContext *ctx_local;
  
  ppSVar3 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar3;
  type_00 = GetVmType(ctx->ctx,data->contextType);
  uVar2 = SmallArray<ArgumentData,_4U>::size(&data->arguments);
  uVar2 = GetArgumentOffset(data,uVar2);
  pVVar4 = LoadFramePointer(ctx,&pSVar1->stack,uVar2,type_00);
  return pVVar4;
}

Assistant:

VmConstant* GetContextValue(InstructionVMEvalContext &ctx, FunctionData *data)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	TypeBase *contextType = data->contextType;

	VmType type = GetVmType(ctx.ctx, contextType);

	unsigned offset = GetArgumentOffset(data, data->arguments.size());

	return LoadFramePointer(ctx, &frame->stack, offset, type);
}